

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkNodeDup(Abc_Ntk_t *pNtkInit,int nLimit,int fVerbose)

{
  Abc_Obj_t *pObj;
  bool bVar1;
  Abc_Ntk_t *pNtkNew;
  uint *__ptr;
  void *pvVar2;
  Vec_Ptr_t *vNodes;
  void **ppvVar3;
  void *pvVar4;
  Vec_Ptr_t *pVVar5;
  Abc_Obj_t *pObj_00;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  
  pNtkNew = Abc_NtkDup(pNtkInit);
  __ptr = (uint *)malloc(0x10);
  __ptr[1] = 0;
  pvVar2 = malloc(800);
  *(void **)(__ptr + 2) = pvVar2;
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  vNodes->pArray = ppvVar3;
  uVar7 = 100;
  do {
    pVVar5 = pNtkNew->vObjs;
    if (pVVar5->nSize < 1) {
      bVar1 = false;
      uVar10 = 0;
    }
    else {
      lVar11 = 0;
      uVar10 = 0;
      do {
        pvVar2 = pVVar5->pArray[lVar11];
        if (((pvVar2 != (void *)0x0) && ((*(uint *)((long)pvVar2 + 0x14) & 0xf) == 7)) &&
           (nLimit <= *(int *)((long)pvVar2 + 0x2c))) {
          iVar9 = (int)uVar10;
          iVar6 = (int)uVar7;
          if (iVar9 == iVar6) {
            if (iVar6 < 0x10) {
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar4 = malloc(0x80);
              }
              else {
                pvVar4 = realloc(*(void **)(__ptr + 2),0x80);
              }
              *(void **)(__ptr + 2) = pvVar4;
              *__ptr = 0x10;
              uVar7 = 0x10;
            }
            else {
              uVar7 = (ulong)(uint)(iVar6 * 2);
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar4 = malloc(uVar7 * 8);
              }
              else {
                pvVar4 = realloc(*(void **)(__ptr + 2),uVar7 * 8);
              }
              *(void **)(__ptr + 2) = pvVar4;
              *__ptr = iVar6 * 2;
            }
          }
          else {
            pvVar4 = *(void **)(__ptr + 2);
          }
          uVar10 = (ulong)(iVar9 + 1);
          *(void **)((long)pvVar4 + (long)iVar9 * 8) = pvVar2;
          pVVar5 = pNtkNew->vObjs;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < pVVar5->nSize);
      bVar1 = 0 < (int)uVar10;
      if ((int)uVar10 < 1) {
        bVar1 = false;
      }
      else {
        lVar11 = *(long *)(__ptr + 2);
        uVar12 = 0;
        do {
          pObj = *(Abc_Obj_t **)(lVar11 + uVar12 * 8);
          pObj_00 = Abc_NtkDupObj(pNtkNew,pObj,0);
          if (0 < (pObj->vFanins).nSize) {
            lVar8 = 0;
            do {
              Abc_ObjAddFanin(pObj_00,(Abc_Obj_t *)
                                      pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar8]]);
              lVar8 = lVar8 + 1;
            } while (lVar8 < (pObj->vFanins).nSize);
          }
          Abc_NodeCollectFanouts(pObj,vNodes);
          if (vNodes->nSize < nLimit / 2) {
            __assert_fail("p->nSize >= nSizeNew",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
          }
          vNodes->nSize = nLimit / 2;
          if (1 < nLimit) {
            lVar8 = 0;
            do {
              Abc_ObjPatchFanin((Abc_Obj_t *)vNodes->pArray[lVar8],pObj,pObj_00);
              lVar8 = lVar8 + 1;
            } while (lVar8 < vNodes->nSize);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar10);
      }
    }
    if (fVerbose != 0) {
      printf("Duplicated %d nodes.\n",uVar10);
    }
    if (!bVar1) {
      if (vNodes->pArray != (void **)0x0) {
        free(vNodes->pArray);
      }
      free(vNodes);
      if (*(void **)(__ptr + 2) != (void *)0x0) {
        free(*(void **)(__ptr + 2));
      }
      free(__ptr);
      return pNtkNew;
    }
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkNodeDup( Abc_Ntk_t * pNtkInit, int nLimit, int fVerbose )
{
    Vec_Ptr_t * vNodes, * vFanouts;
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pObj, * pObjNew, * pFanin, * pFanout;
    int i, k;
    pNtk = Abc_NtkDup( pNtkInit );
    vNodes = Vec_PtrAlloc( 100 );
    vFanouts = Vec_PtrAlloc( 100 );
    do
    {
        Vec_PtrClear( vNodes );
        Abc_NtkForEachNode( pNtk, pObj, i )
            if ( Abc_ObjFanoutNum(pObj) >= nLimit )
                Vec_PtrPush( vNodes, pObj );
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        {
            pObjNew = Abc_NtkDupObj( pNtk, pObj, 0 );
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObjNew, pFanin );
            Abc_NodeCollectFanouts( pObj, vFanouts );
            Vec_PtrShrink( vFanouts, nLimit / 2 );
            Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pFanout, k )
                Abc_ObjPatchFanin( pFanout, pObj, pObjNew );
        }
        if ( fVerbose )
            printf( "Duplicated %d nodes.\n", Vec_PtrSize(vNodes) );
    }
    while ( Vec_PtrSize(vNodes) > 0 );
    Vec_PtrFree( vFanouts );
    Vec_PtrFree( vNodes );
    return pNtk;
}